

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::MultiplyDenseValues(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t *vy;
  uint uVar9;
  uint8_t *__src;
  ushort *puVar10;
  uint8_t *__s;
  uint ii;
  uint count;
  ulong uVar11;
  uint16_t *deck;
  bool bVar12;
  uint16_t bits [500];
  uint16_t rows [500];
  uint8_t *local_860;
  PeelColumn *local_858;
  PCGRandom local_818;
  uint16_t local_808 [504];
  ushort local_418;
  ushort local_416 [499];
  
  local_818.Inc = (ulong)this->_d_seed * 2 + 1;
  local_818.State = local_818.Inc * 0x5851f42d4c957f2e;
  uVar1 = this->_block_count;
  uVar2 = this->_dense_count;
  local_860 = this->_recovery_blocks;
  local_858 = this->_peel_cols;
  __s = local_860 + ((uint)this->_mix_count + (uint)uVar1) * this->_block_bytes;
  uVar7 = (ulong)(uVar2 + 1 >> 1);
  uVar6 = 0;
  do {
    uVar5 = uVar6 & 0xffff;
    if (uVar1 <= uVar5) {
      return;
    }
    count = (uint)uVar2;
    uVar6 = uVar5 + count;
    uVar5 = this->_block_count - uVar5;
    if (uVar6 <= uVar1) {
      uVar5 = count;
    }
    ShuffleDeck16(&local_818,&local_418,count);
    ShuffleDeck16(&local_818,local_808,count);
    __src = (uint8_t *)0x0;
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      uVar3 = local_808[uVar11];
      vy = __src;
      if ((uVar3 < uVar5) && (local_858[uVar3].Mark == '\x01')) {
        uVar9 = this->_block_bytes;
        vy = local_860 + uVar3 * uVar9;
        if (__src != (uint8_t *)0x0) {
          if (__src == __s) {
            gf256_add_mem(__s,vy,uVar9);
            vy = __src;
          }
          else {
            gf256_addset_mem(__s,__src,vy,uVar9);
            vy = __s;
          }
        }
      }
      __src = vy;
    }
    if (__src == (uint8_t *)0x0) {
      memset(__s,0,(ulong)this->_block_bytes);
    }
    else {
      if (__src != __s) {
        memcpy(__s,__src,(ulong)this->_block_bytes);
      }
      if (this->_ge_row_map[local_418] != 0xffff) {
        gf256_add_mem(this->_recovery_blocks +
                      (uint)this->_ge_row_map[local_418] * this->_block_bytes,__s,this->_block_bytes
                     );
      }
    }
    ShuffleDeck16(&local_818,local_808,(uint)uVar2);
    for (uVar11 = 0; (uVar2 & 0xfffffffe) != uVar11; uVar11 = uVar11 + 2) {
      uVar3 = *(ushort *)((long)local_808 + uVar11);
      uVar4 = *(ushort *)((long)local_808 + uVar11 + (uVar2 + 1 & 0xfffffffe));
      uVar9 = (uint)uVar4;
      if ((uVar3 < uVar5) && (local_858[uVar3].Mark == '\x01')) {
        if ((uVar4 < uVar5) && (local_858[uVar4].Mark == '\x01')) {
          uVar8 = this->_block_bytes;
          gf256_add2_mem(__s,local_860 + uVar3 * uVar8,local_860 + uVar9 * uVar8,uVar8);
        }
        else {
          uVar8 = this->_block_bytes;
          uVar9 = uVar3 * uVar8;
LAB_00103f82:
          gf256_add_mem(__s,local_860 + uVar9,uVar8);
        }
      }
      else if ((uVar9 < uVar5) && (local_858[uVar4].Mark == '\x01')) {
        uVar8 = this->_block_bytes;
        uVar9 = uVar9 * uVar8;
        goto LAB_00103f82;
      }
      if (this->_ge_row_map[*(ushort *)((long)local_416 + uVar11)] != 0xffff) {
        gf256_add_mem(this->_recovery_blocks +
                      (uint)this->_ge_row_map[*(ushort *)((long)local_416 + uVar11)] *
                      this->_block_bytes,__s,this->_block_bytes);
      }
    }
    deck = local_808;
    ShuffleDeck16(&local_818,deck,(uint)uVar2);
    puVar10 = (ushort *)((long)local_416 + uVar11);
    uVar11 = (ulong)(((uVar2 >> 1) - 1) + (uVar2 & 1));
    while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
      uVar3 = *deck;
      uVar4 = deck[uVar7];
      uVar9 = (uint)uVar4;
      if ((uVar3 < uVar5) && (local_858[uVar3].Mark == '\x01')) {
        if ((uVar4 < uVar5) && (local_858[uVar4].Mark == '\x01')) {
          uVar8 = this->_block_bytes;
          gf256_add2_mem(__s,local_860 + uVar3 * uVar8,local_860 + uVar9 * uVar8,uVar8);
        }
        else {
          uVar8 = this->_block_bytes;
          uVar9 = uVar3 * uVar8;
LAB_0010407d:
          gf256_add_mem(__s,local_860 + uVar9,uVar8);
        }
      }
      else if ((uVar9 < uVar5) && (local_858[uVar4].Mark == '\x01')) {
        uVar8 = this->_block_bytes;
        uVar9 = uVar9 * uVar8;
        goto LAB_0010407d;
      }
      if (this->_ge_row_map[*puVar10] != 0xffff) {
        gf256_add_mem(this->_recovery_blocks +
                      (uint)this->_ge_row_map[*puVar10] * this->_block_bytes,__s,this->_block_bytes)
        ;
      }
      puVar10 = puVar10 + 1;
      deck = deck + 1;
    }
    local_858 = local_858 + uVar2;
    local_860 = local_860 + this->_block_bytes * count;
  } while( true );
}

Assistant:

void Codec::MultiplyDenseValues()
{
    CAT_IF_DUMP(cout << endl << "---- MultiplyDenseValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    // Initialize PRNG
    PCGRandom prng;
    prng.Seed(_d_seed);

    const uint16_t dense_count = _dense_count;
    CAT_DEBUG_ASSERT((unsigned)(_block_count + _mix_count) < _recovery_rows);
    uint8_t * GF256_RESTRICT temp_block = _recovery_blocks + _block_bytes * (_block_count + _mix_count);
    const uint8_t * GF256_RESTRICT source_block = _recovery_blocks;
    const PeelColumn * GF256_RESTRICT column = _peel_cols;
    uint16_t rows[CAT_MAX_DENSE_ROWS];
    uint16_t bits[CAT_MAX_DENSE_ROWS];
    const uint16_t block_count = _block_count;

    // For each block of columns:
    for (uint16_t column_i = 0; column_i < block_count; column_i += dense_count,
        column += dense_count, source_block += _block_bytes * dense_count)
    {
        unsigned max_x = dense_count;

        // Handle final columns
        if (column_i + dense_count > block_count) {
            max_x = _block_count - column_i;
        }

        CAT_IF_DUMP(cout << endl << "For window of columns between " << column_i <<
            " and " << column_i + dense_count - 1 << " (inclusive):" << endl;)

        // Shuffle row and bit order
        ShuffleDeck16(prng, rows, dense_count);
        ShuffleDeck16(prng, bits, dense_count);

        // Initialize counters
        const uint16_t set_count = (dense_count + 1) >> 1;
        uint16_t * GF256_RESTRICT set_bits = bits;
        uint16_t * GF256_RESTRICT clr_bits = set_bits + set_count;
        const uint16_t * GF256_RESTRICT row = rows;

        CAT_IF_DUMP(cout << "Generating first row " << _ge_row_map[*row] << ":";)

        // Generate first row
        const uint8_t * GF256_RESTRICT combo = 0;
        CAT_IF_ROWOP(++rowops;)

        for (unsigned ii = 0; ii < set_count; ++ii)
        {
            unsigned bit_i = set_bits[ii];

            // If bit is peeled:
            if (bit_i < max_x && column[bit_i].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit_i;)

                const uint8_t * GF256_RESTRICT src = source_block + _block_bytes * bit_i;

                // If no combo used yet:
                if (!combo) {
                    combo = src;
                }
                else if (combo == temp_block)
                {
                    // Else if combo has been used: XOR it in
                    gf256_add_mem(temp_block, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)
                }
                else
                {
                    // Else if combo needs to be used: Combine into block
                    gf256_addset_mem(temp_block, combo, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)

                    combo = temp_block;
                }
            }
        }

        CAT_IF_DUMP(cout << endl;)

        // If no combo ever triggered:
        if (!combo) {
            memset(temp_block, 0, _block_bytes);
        }
        else
        {
            // Else if never combined two: Just copy it
            if (combo != temp_block)
            {
                memcpy(temp_block, combo, _block_bytes);
                CAT_IF_ROWOP(++rowops;)
            }

            const uint16_t dest_column_i = _ge_row_map[*row];

            // Store in destination column in recovery blocks
            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
                gf256_add_mem(_recovery_blocks + _block_bytes * dest_column_i, temp_block, _block_bytes);
                CAT_IF_ROWOP(++rowops;)
            }
        }

        ++row;

        // Reshuffle bit order: Shuffle-2 Code
        ShuffleDeck16(prng, bits, dense_count);

        const unsigned loop_count = (dense_count >> 1);
        CAT_DEBUG_ASSERT(loop_count < CAT_MAX_DENSE_ROWS);

        // Generate first half of rows
        for (unsigned ii = 0; ii < loop_count; ++ii)
        {
            CAT_IF_DUMP(cout << "Flipping bits for derivative row " << _ge_row_map[*row] << ":";)

            CAT_DEBUG_ASSERT(ii < CAT_MAX_DENSE_ROWS);
            const unsigned bit0 = set_bits[ii];
            const unsigned bit1 = clr_bits[ii];

            // Add in peeled columns
            if (bit0 < max_x && column[bit0].Mark == MARK_PEEL)
            {
                if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0 << "+" << column_i + bit1;)

                    gf256_add2_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        source_block + _block_bytes * bit1,
                        _block_bytes);
                }
                else
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0;)

                    gf256_add_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        _block_bytes);
                }
                CAT_IF_ROWOP(++rowops;)
            }
            else if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit1;)

                gf256_add_mem(
                    temp_block,
                    source_block + _block_bytes * bit1,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }

            CAT_IF_DUMP(cout << endl;)

            const uint16_t dest_column_i = _ge_row_map[*row++];

            // Store in destination column in recovery blocks
            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);

                gf256_add_mem(
                    _recovery_blocks + _block_bytes * dest_column_i,
                    temp_block,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }
        }

        // Reshuffle bit order: Shuffle-2 Code
        ShuffleDeck16(prng, bits, dense_count);

        const unsigned second_loop_count = loop_count - 1 + (dense_count & 1);
        CAT_DEBUG_ASSERT(second_loop_count < CAT_MAX_DENSE_ROWS);

        // Generate second half of rows
        for (unsigned ii = 0; ii < second_loop_count; ++ii)
        {
            CAT_IF_DUMP(cout << "Flipping bits for derivative row " << _ge_row_map[*row] << ":";)

            // Add in peeled columns
            CAT_DEBUG_ASSERT(ii < CAT_MAX_DENSE_ROWS);
            const unsigned bit0 = set_bits[ii];
            const unsigned bit1 = clr_bits[ii];

            if (bit0 < max_x && column[bit0].Mark == MARK_PEEL)
            {
                if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0 << "+" << column_i + bit1;)

                    CAT_DEBUG_ASSERT(bit0 < _block_count);
                    CAT_DEBUG_ASSERT(bit1 < _block_count);

                    gf256_add2_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        source_block + _block_bytes * bit1,
                        _block_bytes);
                }
                else
                {
                    CAT_IF_DUMP(cout << " " << column_i + bit0;)

                    CAT_DEBUG_ASSERT(bit0 < _block_count);

                    gf256_add_mem(
                        temp_block,
                        source_block + _block_bytes * bit0,
                        _block_bytes);
                }

                CAT_IF_ROWOP(++rowops;)
            }
            else if (bit1 < max_x && column[bit1].Mark == MARK_PEEL)
            {
                CAT_IF_DUMP(cout << " " << column_i + bit1;)

                CAT_DEBUG_ASSERT(bit1 < _block_count);

                gf256_add_mem(
                    temp_block,
                    source_block + _block_bytes * bit1,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }

            CAT_IF_DUMP(cout << endl;)

            // Store in destination column in recovery blocks
            const uint16_t dest_column_i = _ge_row_map[*row++];

            if (dest_column_i != LIST_TERM)
            {
                CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);

                gf256_add_mem(
                    _recovery_blocks + _block_bytes * dest_column_i,
                    temp_block,
                    _block_bytes);

                CAT_IF_ROWOP(++rowops;)
            }
        }
    } // next column

    CAT_IF_ROWOP(cout << "MultiplyDenseValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}